

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XLearnCV(XL *out)

{
  Solver *this;
  HyperParam *hyper_param;
  ostream *poVar1;
  float fVar2;
  Modifier reset;
  Modifier bold;
  Modifier green;
  Timer timer;
  Modifier local_4c;
  Modifier local_48;
  Modifier local_44;
  Timer local_40;
  string local_30;
  
  Timer::Timer(&local_40);
  Timer::tic(&local_40);
  hyper_param = (HyperParam *)*out;
  this = (Solver *)(hyper_param + 1);
  hyper_param->cross_validation = true;
  hyper_param->is_train = true;
  xLearn::Solver::Initialize(this,hyper_param);
  xLearn::Solver::StartWork(this);
  xLearn::Solver::Clear(this);
  hyper_param->cross_validation = false;
  fVar2 = Timer::toc(&local_40);
  StringPrintf_abi_cxx11_(&local_30,"Total time cost: %.2f (sec)",(double)fVar2);
  local_48.code = BOLD;
  local_4c.code = RESET;
  local_44.code = FG_GREEN;
  poVar1 = Color::operator<<((ostream *)&std::cout,&local_44);
  poVar1 = Color::operator<<(poVar1,&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[------------] ",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
  poVar1 = Color::operator<<(poVar1,&local_4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

XL_DLL int XLearnCV(XL *out) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().cross_validation = true;
  xl->GetHyperParam().is_train = true;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  xl->GetHyperParam().cross_validation = false;
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}